

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O0

void sdefl_huff(uchar *lens,uint *codes,uint *freqs,uint num_syms,uint max_code_len)

{
  uint uVar1;
  uint local_88;
  uint i;
  uint s;
  uint used_syms;
  uint len_cnt [16];
  uint *A;
  uint c;
  uint max_code_len_local;
  uint num_syms_local;
  uint *freqs_local;
  uint *codes_local;
  uchar *lens_local;
  
  len_cnt._56_8_ = codes;
  uVar1 = sdefl_sort_sym(num_syms,freqs,lens,codes);
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      local_88 = *(uint *)len_cnt._56_8_ & 0x3ff;
      if (local_88 == 0) {
        local_88 = 1;
      }
      *codes = 0;
      *lens = '\x01';
      codes[local_88] = 1;
      lens[local_88] = '\x01';
    }
    else {
      sdefl_build_tree((uint *)len_cnt._56_8_,uVar1);
      sdefl_gen_len_cnt((uint *)len_cnt._56_8_,uVar1 - 2,&s,max_code_len);
      sdefl_gen_codes((uint *)len_cnt._56_8_,lens,&s,max_code_len,num_syms);
      for (A._4_4_ = 0; A._4_4_ < num_syms; A._4_4_ = A._4_4_ + 1) {
        uVar1 = sdefl_rev(codes[A._4_4_],lens[A._4_4_]);
        codes[A._4_4_] = uVar1;
      }
    }
  }
  return;
}

Assistant:

static void
sdefl_huff(unsigned char *lens, unsigned *codes, unsigned *freqs,
           unsigned num_syms, unsigned max_code_len) {
  unsigned c, *A = codes;
  unsigned len_cnt[SDEFL_MAX_CODE_LEN + 1];
  unsigned used_syms = sdefl_sort_sym(num_syms, freqs, lens, A);
  if (!used_syms) return;
  if (used_syms == 1) {
    unsigned s = A[0] & SDEFL_SYM_MSK;
    unsigned i = s ? s : 1;
    codes[0] = 0, lens[0] = 1;
    codes[i] = 1, lens[i] = 1;
    return;
  }
  sdefl_build_tree(A, used_syms);
  sdefl_gen_len_cnt(A, used_syms-2, len_cnt, max_code_len);
  sdefl_gen_codes(A, lens, len_cnt, max_code_len, num_syms);
  for (c = 0; c < num_syms; c++) {
    codes[c] = sdefl_rev(codes[c], lens[c]);
  }
}